

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O0

VariableNT __thiscall
adios2::IO::DefineVariable
          (IO *this,DataType type,string *name,Dims *shape,Dims *start,Dims *count,bool constantDims
          )

{
  byte bVar1;
  __type _Var2;
  Variable *pVVar3;
  vector *in_RCX;
  vector *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  vector *in_R8;
  undefined1 in_R9B;
  byte in_stack_00000008;
  undefined1 in_stack_fffffffffffffb90;
  undefined1 in_stack_fffffffffffffb91;
  undefined1 in_stack_fffffffffffffb92;
  undefined1 in_stack_fffffffffffffb93;
  undefined1 in_stack_fffffffffffffb94;
  undefined1 in_stack_fffffffffffffb95;
  undefined1 in_stack_fffffffffffffb96;
  undefined1 in_stack_fffffffffffffb97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  char *in_stack_fffffffffffffbd8;
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [24];
  string *in_stack_fffffffffffffc48;
  IO *in_stack_fffffffffffffc50;
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  string local_60 [39];
  byte local_39;
  bool local_38;
  vector *local_30;
  vector *local_28;
  vector *local_20;
  VariableNT local_8;
  
  local_39 = in_stack_00000008 & 1;
  __rhs = local_80;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_38 = (bool)in_R9B;
  std::operator+(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  std::operator+(in_RDI,(char *)CONCAT17(in_stack_fffffffffffffb97,
                                         CONCAT16(in_stack_fffffffffffffb96,
                                                  CONCAT15(in_stack_fffffffffffffb95,
                                                           CONCAT14(in_stack_fffffffffffffb94,
                                                                    CONCAT13(
                                                  in_stack_fffffffffffffb93,
                                                  CONCAT12(in_stack_fffffffffffffb92,
                                                           CONCAT11(in_stack_fffffffffffffb91,
                                                                    in_stack_fffffffffffffb90)))))))
                );
  helper::CheckForNullptr<adios2::core::IO>(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)local_80);
  adios2::ToString_abi_cxx11_((DataType)local_b0);
  GetType<std::__cxx11::string>();
  bVar1 = std::operator==(in_stack_fffffffffffffbb0,__rhs);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_b0);
  if ((bVar1 & 1) == 0) {
    adios2::ToString_abi_cxx11_((DataType)local_f0);
    GetType<char>();
    bVar1 = std::operator==(in_stack_fffffffffffffbb0,__rhs);
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string(local_f0);
    if ((bVar1 & 1) == 0) {
      adios2::ToString_abi_cxx11_((DataType)local_130);
      GetType<signed_char>();
      bVar1 = std::operator==(in_stack_fffffffffffffbb0,__rhs);
      std::__cxx11::string::~string(local_150);
      std::__cxx11::string::~string(local_130);
      if ((bVar1 & 1) == 0) {
        adios2::ToString_abi_cxx11_((DataType)local_170);
        GetType<short>();
        bVar1 = std::operator==(in_stack_fffffffffffffbb0,__rhs);
        std::__cxx11::string::~string(local_190);
        std::__cxx11::string::~string(local_170);
        if ((bVar1 & 1) == 0) {
          adios2::ToString_abi_cxx11_((DataType)local_1b0);
          GetType<int>();
          bVar1 = std::operator==(in_stack_fffffffffffffbb0,__rhs);
          std::__cxx11::string::~string(local_1d0);
          std::__cxx11::string::~string(local_1b0);
          if ((bVar1 & 1) == 0) {
            adios2::ToString_abi_cxx11_((DataType)local_1f0);
            GetType<long>();
            bVar1 = std::operator==(in_stack_fffffffffffffbb0,__rhs);
            std::__cxx11::string::~string(local_210);
            std::__cxx11::string::~string(local_1f0);
            if ((bVar1 & 1) == 0) {
              adios2::ToString_abi_cxx11_((DataType)local_230);
              GetType<unsigned_char>();
              bVar1 = std::operator==(in_stack_fffffffffffffbb0,__rhs);
              std::__cxx11::string::~string(local_250);
              std::__cxx11::string::~string(local_230);
              if ((bVar1 & 1) == 0) {
                adios2::ToString_abi_cxx11_((DataType)local_270);
                GetType<unsigned_short>();
                bVar1 = std::operator==(in_stack_fffffffffffffbb0,__rhs);
                std::__cxx11::string::~string(local_290);
                std::__cxx11::string::~string(local_270);
                if ((bVar1 & 1) == 0) {
                  adios2::ToString_abi_cxx11_((DataType)local_2b0);
                  GetType<unsigned_int>();
                  _Var2 = std::operator==(in_stack_fffffffffffffbb0,__rhs);
                  std::__cxx11::string::~string(local_2d0);
                  std::__cxx11::string::~string(local_2b0);
                  if (_Var2) {
                    pVVar3 = adios2::core::IO::DefineVariable<unsigned_int>
                                       (*(string **)in_RDI,local_20,local_28,local_30,local_38);
                    VariableNT::VariableNT(&local_8,(VariableBase *)pVVar3);
                  }
                  else {
                    adios2::ToString_abi_cxx11_((DataType)local_2f0);
                    GetType<unsigned_long>();
                    _Var2 = std::operator==(in_stack_fffffffffffffbb0,__rhs);
                    std::__cxx11::string::~string(local_310);
                    std::__cxx11::string::~string(local_2f0);
                    if (_Var2) {
                      pVVar3 = adios2::core::IO::DefineVariable<unsigned_long>
                                         (*(string **)in_RDI,local_20,local_28,local_30,local_38);
                      VariableNT::VariableNT(&local_8,(VariableBase *)pVVar3);
                    }
                    else {
                      adios2::ToString_abi_cxx11_((DataType)local_330);
                      GetType<float>();
                      _Var2 = std::operator==(in_stack_fffffffffffffbb0,__rhs);
                      std::__cxx11::string::~string(local_350);
                      std::__cxx11::string::~string(local_330);
                      if (_Var2) {
                        pVVar3 = adios2::core::IO::DefineVariable<float>
                                           (*(string **)in_RDI,local_20,local_28,local_30,local_38);
                        VariableNT::VariableNT(&local_8,(VariableBase *)pVVar3);
                      }
                      else {
                        adios2::ToString_abi_cxx11_((DataType)local_370);
                        GetType<double>();
                        _Var2 = std::operator==(in_stack_fffffffffffffbb0,__rhs);
                        std::__cxx11::string::~string(local_390);
                        std::__cxx11::string::~string(local_370);
                        if (_Var2) {
                          pVVar3 = adios2::core::IO::DefineVariable<double>
                                             (*(string **)in_RDI,local_20,local_28,local_30,local_38
                                             );
                          VariableNT::VariableNT(&local_8,(VariableBase *)pVVar3);
                        }
                        else {
                          adios2::ToString_abi_cxx11_((DataType)&stack0xfffffffffffffc50);
                          GetType<long_double>();
                          _Var2 = std::operator==(in_stack_fffffffffffffbb0,__rhs);
                          std::__cxx11::string::~string(local_3d0);
                          std::__cxx11::string::~string((string *)&stack0xfffffffffffffc50);
                          if (_Var2) {
                            pVVar3 = adios2::core::IO::DefineVariable<long_double>
                                               (*(string **)in_RDI,local_20,local_28,local_30,
                                                local_38);
                            VariableNT::VariableNT(&local_8,(VariableBase *)pVVar3);
                          }
                          else {
                            adios2::ToString_abi_cxx11_((DataType)local_3f0);
                            GetType<std::complex<float>>();
                            _Var2 = std::operator==(in_stack_fffffffffffffbb0,__rhs);
                            std::__cxx11::string::~string(local_410);
                            std::__cxx11::string::~string(local_3f0);
                            if (_Var2) {
                              pVVar3 = adios2::core::IO::DefineVariable<std::complex<float>>
                                                 (*(string **)in_RDI,local_20,local_28,local_30,
                                                  local_38);
                              VariableNT::VariableNT(&local_8,(VariableBase *)pVVar3);
                            }
                            else {
                              adios2::ToString_abi_cxx11_((DataType)&stack0xfffffffffffffbd0);
                              GetType<std::complex<double>>();
                              _Var2 = std::operator==(in_stack_fffffffffffffbb0,__rhs);
                              std::__cxx11::string::~string((string *)&stack0xfffffffffffffbb0);
                              std::__cxx11::string::~string((string *)&stack0xfffffffffffffbd0);
                              if (_Var2) {
                                pVVar3 = adios2::core::IO::DefineVariable<std::complex<double>>
                                                   (*(string **)in_RDI,local_20,local_28,local_30,
                                                    local_38);
                                VariableNT::VariableNT(&local_8,(VariableBase *)pVVar3);
                              }
                              else {
                                VariableNT::VariableNT(&local_8,(VariableBase *)0x0);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  pVVar3 = adios2::core::IO::DefineVariable<unsigned_short>
                                     (*(string **)in_RDI,local_20,local_28,local_30,local_38);
                  VariableNT::VariableNT(&local_8,(VariableBase *)pVVar3);
                }
              }
              else {
                pVVar3 = adios2::core::IO::DefineVariable<unsigned_char>
                                   (*(string **)in_RDI,local_20,local_28,local_30,local_38);
                VariableNT::VariableNT(&local_8,(VariableBase *)pVVar3);
              }
            }
            else {
              pVVar3 = adios2::core::IO::DefineVariable<long>
                                 (*(string **)in_RDI,local_20,local_28,local_30,local_38);
              VariableNT::VariableNT(&local_8,(VariableBase *)pVVar3);
            }
          }
          else {
            pVVar3 = adios2::core::IO::DefineVariable<int>
                               (*(string **)in_RDI,local_20,local_28,local_30,local_38);
            VariableNT::VariableNT(&local_8,(VariableBase *)pVVar3);
          }
        }
        else {
          pVVar3 = adios2::core::IO::DefineVariable<short>
                             (*(string **)in_RDI,local_20,local_28,local_30,local_38);
          VariableNT::VariableNT(&local_8,(VariableBase *)pVVar3);
        }
      }
      else {
        pVVar3 = adios2::core::IO::DefineVariable<signed_char>
                           (*(string **)in_RDI,local_20,local_28,local_30,local_38);
        VariableNT::VariableNT(&local_8,(VariableBase *)pVVar3);
      }
    }
    else {
      pVVar3 = adios2::core::IO::DefineVariable<char>
                         (*(string **)in_RDI,local_20,local_28,local_30,local_38);
      VariableNT::VariableNT(&local_8,(VariableBase *)pVVar3);
    }
  }
  else {
    pVVar3 = adios2::core::IO::DefineVariable<std::__cxx11::string>
                       (*(string **)in_RDI,local_20,local_28,local_30,local_38);
    VariableNT::VariableNT(&local_8,(VariableBase *)pVVar3);
  }
  return (VariableNT)local_8.m_Variable;
}

Assistant:

VariableNT IO::DefineVariable(const DataType type, const std::string &name, const Dims &shape,
                              const Dims &start, const Dims &count, const bool constantDims)
{
    helper::CheckForNullptr(m_IO, "for variable name " + name + ", in call to IO::DefineVariable");
#define declare_type(T)                                                                            \
    if (ToString(type) == GetType<T>())                                                            \
    {                                                                                              \
        return VariableNT(&m_IO->DefineVariable<typename TypeInfo<T>::IOType>(                     \
            name, shape, start, count, constantDims));                                             \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    else
    {
        return nullptr;
    }
}